

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trend.cpp
# Opt level: O2

RegressionModel Trend::fromString(string *value)

{
  pointer_____offset_0x10___ *ppuVar1;
  KrigingException *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  ppuVar1 = std::
            __find_if<char_const*const*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                      (enum_RegressionModel_strings,&KrigingException::typeinfo,value);
  if (ppuVar1 != &KrigingException::typeinfo) {
    return (RegressionModel)((ulong)(ppuVar1 + -0x36ed6) >> 3);
  }
  this = (KrigingException *)__cxa_allocate_exception(0x28);
  std::operator+(&bStack_58,"Cannot convert \'",value);
  std::operator+(&local_38,&bStack_58,"\' as a regression model");
  KrigingException::KrigingException(this,&local_38);
  __cxa_throw(this,&KrigingException::typeinfo,KrigingException::~KrigingException);
}

Assistant:

Trend::RegressionModel Trend::fromString(const std::string& value) {
  static auto begin = std::begin(Trend::enum_RegressionModel_strings);
  static auto end = std::end(Trend::enum_RegressionModel_strings);

  auto find = std::find(begin, end, value);
  if (find != end) {
    return static_cast<Trend::RegressionModel>(std::distance(begin, find));
  } else {
    // FIXME use std::optional as returned type
    throw KrigingException("Cannot convert '" + value + "' as a regression model");
  }
}